

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int createCollation(sqlite3 *db,char *zName,u8 enc,void *pCtx,
                   _func_int_void_ptr_int_void_ptr_int_void_ptr *xCompare,_func_void_void_ptr *xDel)

{
  code *pcVar1;
  int iVar2;
  CollSeq *pCVar3;
  void *pvVar4;
  undefined7 in_register_00000011;
  char *zFormat;
  long lVar5;
  uint uVar6;
  byte enc_00;
  uint uVar7;
  
  uVar7 = (uint)CONCAT71(in_register_00000011,enc);
  iVar2 = sqlite3Strlen30(zName);
  uVar6 = 2;
  if ((uVar7 - 4 & 0xfb) != 0) {
    uVar6 = uVar7;
  }
  if (uVar6 - 4 < 0xfffffffd) {
    sqlite3MisuseError(0x1c80f);
    return 0x15;
  }
  enc_00 = (byte)uVar6;
  pCVar3 = sqlite3FindCollSeq(db,enc_00,zName,0);
  if ((pCVar3 != (CollSeq *)0x0) &&
     (pCVar3->xCmp != (_func_int_void_ptr_int_void_ptr_int_void_ptr *)0x0)) {
    if (db->activeVdbeCnt != 0) {
      zFormat = "unable to delete/modify collation sequence due to active statements";
      iVar2 = 5;
      goto LAB_00121c0d;
    }
    sqlite3ExpirePreparedStatements(db);
    if (uVar6 == (pCVar3->enc & 0xfffffff7)) {
      pvVar4 = sqlite3HashFind(&db->aCollSeq,zName,iVar2);
      for (lVar5 = 0; lVar5 != 0x78; lVar5 = lVar5 + 0x28) {
        if (*(u8 *)((long)pvVar4 + lVar5 + 8) == pCVar3->enc) {
          pcVar1 = *(code **)((long)pvVar4 + lVar5 + 0x20);
          if (pcVar1 != (code *)0x0) {
            (*pcVar1)(*(undefined8 *)((long)pvVar4 + lVar5 + 0x10));
          }
          *(undefined8 *)((long)pvVar4 + lVar5 + 0x18) = 0;
        }
      }
    }
  }
  pCVar3 = sqlite3FindCollSeq(db,enc_00,zName,1);
  if (pCVar3 == (CollSeq *)0x0) {
    return 7;
  }
  pCVar3->xCmp = xCompare;
  pCVar3->pUser = pCtx;
  pCVar3->xDel = xDel;
  pCVar3->enc = enc_00 | enc & 8;
  iVar2 = 0;
  zFormat = (char *)0x0;
LAB_00121c0d:
  sqlite3Error(db,iVar2,zFormat);
  return iVar2;
}

Assistant:

static int createCollation(
  sqlite3* db,
  const char *zName, 
  u8 enc,
  void* pCtx,
  int(*xCompare)(void*,int,const void*,int,const void*),
  void(*xDel)(void*)
){
  CollSeq *pColl;
  int enc2;
  int nName = sqlite3Strlen30(zName);
  
  assert( sqlite3_mutex_held(db->mutex) );

  /* If SQLITE_UTF16 is specified as the encoding type, transform this
  ** to one of SQLITE_UTF16LE or SQLITE_UTF16BE using the
  ** SQLITE_UTF16NATIVE macro. SQLITE_UTF16 is not used internally.
  */
  enc2 = enc;
  testcase( enc2==SQLITE_UTF16 );
  testcase( enc2==SQLITE_UTF16_ALIGNED );
  if( enc2==SQLITE_UTF16 || enc2==SQLITE_UTF16_ALIGNED ){
    enc2 = SQLITE_UTF16NATIVE;
  }
  if( enc2<SQLITE_UTF8 || enc2>SQLITE_UTF16BE ){
    return SQLITE_MISUSE_BKPT;
  }

  /* Check if this call is removing or replacing an existing collation 
  ** sequence. If so, and there are active VMs, return busy. If there
  ** are no active VMs, invalidate any pre-compiled statements.
  */
  pColl = sqlite3FindCollSeq(db, (u8)enc2, zName, 0);
  if( pColl && pColl->xCmp ){
    if( db->activeVdbeCnt ){
      sqlite3Error(db, SQLITE_BUSY, 
        "unable to delete/modify collation sequence due to active statements");
      return SQLITE_BUSY;
    }
    sqlite3ExpirePreparedStatements(db);

    /* If collation sequence pColl was created directly by a call to
    ** sqlite3_create_collation, and not generated by synthCollSeq(),
    ** then any copies made by synthCollSeq() need to be invalidated.
    ** Also, collation destructor - CollSeq.xDel() - function may need
    ** to be called.
    */ 
    if( (pColl->enc & ~SQLITE_UTF16_ALIGNED)==enc2 ){
      CollSeq *aColl = sqlite3HashFind(&db->aCollSeq, zName, nName);
      int j;
      for(j=0; j<3; j++){
        CollSeq *p = &aColl[j];
        if( p->enc==pColl->enc ){
          if( p->xDel ){
            p->xDel(p->pUser);
          }
          p->xCmp = 0;
        }
      }
    }
  }

  pColl = sqlite3FindCollSeq(db, (u8)enc2, zName, 1);
  if( pColl==0 ) return SQLITE_NOMEM;
  pColl->xCmp = xCompare;
  pColl->pUser = pCtx;
  pColl->xDel = xDel;
  pColl->enc = (u8)(enc2 | (enc & SQLITE_UTF16_ALIGNED));
  sqlite3Error(db, SQLITE_OK, 0);
  return SQLITE_OK;
}